

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.h
# Opt level: O0

void pbrt::ErrorExit<int&>(FileLoc *loc,char *fmt,int *args)

{
  FileLoc *in_RDI;
  char *message;
  char local_38 [8];
  int *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  
  message = local_38;
  StringPrintf<int&>(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  std::__cxx11::string::c_str();
  ErrorExit(in_RDI,message);
}

Assistant:

[[noreturn]] inline void ErrorExit(const FileLoc *loc, const char *fmt, Args &&... args) {
    ErrorExit(loc, StringPrintf(fmt, std::forward<Args>(args)...).c_str());
}